

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  mbedtls_sha512_context *ctx;
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  uchar buf [64];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar11;
  
  iVar2 = -0x3c;
  if (len < 0x41) {
    iVar7 = 1;
    do {
      iVar2 = entropy_gather_internal((mbedtls_entropy_context *)data);
      if (iVar2 != 0) goto LAB_001103ec;
      if (0 < (long)*(int *)((long)data + 0xe0)) {
        uVar4 = 1;
        lVar5 = 0;
        uVar3 = 0;
        do {
          uVar6 = *(ulong *)((long)data + lVar5 + 0xf8);
          if (uVar6 < *(ulong *)((long)data + lVar5 + 0x100)) {
            uVar4 = 0;
          }
          if (*(int *)((long)data + lVar5 + 0x108) != 1) {
            uVar6 = 0;
          }
          uVar3 = uVar3 + uVar6;
          lVar5 = lVar5 + 0x28;
        } while ((long)*(int *)((long)data + 0xe0) * 0x28 != lVar5);
        if (((int)uVar4 != 0) && (0x3f < uVar3)) {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          ctx = (mbedtls_sha512_context *)((long)data + 8);
          iVar2 = mbedtls_sha512_finish_ret(ctx,local_78);
          if (iVar2 == 0) {
            mbedtls_sha512_free(ctx);
            mbedtls_sha512_init(ctx);
            iVar2 = mbedtls_sha512_starts_ret(ctx,0);
            if (((iVar2 == 0) && (iVar2 = mbedtls_sha512_update_ret(ctx,local_78,0x40), iVar2 == 0))
               && (iVar2 = mbedtls_sha512_ret(local_78,0x40,local_78,0), auVar1 = _DAT_0013c8f0,
                  iVar2 == 0)) {
              iVar2 = *(int *)((long)data + 0xe0);
              if (0 < (long)iVar2) {
                lVar5 = (long)iVar2 + -1;
                auVar9._8_4_ = (int)lVar5;
                auVar9._0_8_ = lVar5;
                auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
                lVar5 = 0;
                auVar9 = auVar9 ^ _DAT_0013c8f0;
                auVar10 = _DAT_0013c8e0;
                do {
                  auVar12 = auVar10 ^ auVar1;
                  if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                              auVar9._4_4_ < auVar12._4_4_) & 1)) {
                    *(undefined8 *)((long)data + lVar5 + 0xf8) = 0;
                  }
                  if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
                      auVar12._12_4_ <= auVar9._12_4_) {
                    *(undefined8 *)((long)data + lVar5 + 0x120) = 0;
                  }
                  lVar11 = auVar10._8_8_;
                  auVar10._0_8_ = auVar10._0_8_ + 2;
                  auVar10._8_8_ = lVar11 + 2;
                  lVar5 = lVar5 + 0x50;
                } while ((ulong)(iVar2 + 1U >> 1) * 0x50 != lVar5);
              }
              memcpy(output,local_78,len);
              iVar2 = 0;
            }
          }
          goto LAB_001103ec;
        }
      }
      bVar8 = iVar7 != 0x101;
      iVar7 = iVar7 + 1;
    } while (bVar8);
    iVar2 = -0x3c;
LAB_001103ec:
    mbedtls_platform_zeroize(local_78,0x40);
  }
  return iVar2;
}

Assistant:

int mbedtls_entropy_func( void *data, unsigned char *output, size_t len )
{
    int ret, count = 0, i, thresholds_reached;
    size_t strong_size;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( len > MBEDTLS_ENTROPY_BLOCK_SIZE )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if( ctx->initial_entropy_run == 0 )
    {
        ctx->initial_entropy_run = 1;
        if( ( ret = mbedtls_entropy_update_nv_seed( ctx ) ) != 0 )
            return( ret );
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /*
     * Always gather extra entropy before a call
     */
    do
    {
        if( count++ > ENTROPY_MAX_LOOP )
        {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if( ( ret = entropy_gather_internal( ctx ) ) != 0 )
            goto exit;

        thresholds_reached = 1;
        strong_size = 0;
        for( i = 0; i < ctx->source_count; i++ )
        {
            if( ctx->source[i].size < ctx->source[i].threshold )
                thresholds_reached = 0;
            if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
                strong_size += ctx->source[i].size;
        }
    }
    while( ! thresholds_reached || strong_size < MBEDTLS_ENTROPY_BLOCK_SIZE );

    memset( buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE );

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    /*
     * Note that at this stage it is assumed that the accumulator was started
     * in a previous call to entropy_update(). If this is not guaranteed, the
     * code below will fail.
     */
    if( ( ret = mbedtls_sha512_finish_ret( &ctx->accumulator, buf ) ) != 0 )
        goto exit;

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_sha512_free( &ctx->accumulator );
    mbedtls_sha512_init( &ctx->accumulator );
    if( ( ret = mbedtls_sha512_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_sha512_update_ret( &ctx->accumulator, buf,
                                           MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    /*
     * Perform second SHA-512 on entropy
     */
    if( ( ret = mbedtls_sha512_ret( buf, MBEDTLS_ENTROPY_BLOCK_SIZE,
                                    buf, 0 ) ) != 0 )
        goto exit;
#else /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */
    if( ( ret = mbedtls_sha256_finish_ret( &ctx->accumulator, buf ) ) != 0 )
        goto exit;

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_sha256_free( &ctx->accumulator );
    mbedtls_sha256_init( &ctx->accumulator );
    if( ( ret = mbedtls_sha256_starts_ret( &ctx->accumulator, 0 ) ) != 0 )
        goto exit;
    if( ( ret = mbedtls_sha256_update_ret( &ctx->accumulator, buf,
                                           MBEDTLS_ENTROPY_BLOCK_SIZE ) ) != 0 )
        goto exit;

    /*
     * Perform second SHA-256 on entropy
     */
    if( ( ret = mbedtls_sha256_ret( buf, MBEDTLS_ENTROPY_BLOCK_SIZE,
                                    buf, 0 ) ) != 0 )
        goto exit;
#endif /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */

    for( i = 0; i < ctx->source_count; i++ )
        ctx->source[i].size = 0;

    memcpy( output, buf, len );

    ret = 0;

exit:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}